

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

uint8_t * __thiscall HEVCStreamReader::writeNalPrefix(HEVCStreamReader *this,uint8_t *curPos)

{
  uint8_t *local_18;
  uint8_t *curPos_local;
  HEVCStreamReader *this_local;
  
  local_18 = curPos;
  if (((this->super_MPEGStreamReader).m_shortStartCodes & 1U) == 0) {
    local_18 = curPos + 1;
    *curPos = '\0';
  }
  *local_18 = '\0';
  local_18[1] = '\0';
  local_18[2] = '\x01';
  return local_18 + 3;
}

Assistant:

uint8_t* HEVCStreamReader::writeNalPrefix(uint8_t* curPos) const
{
    if (!m_shortStartCodes)
        *curPos++ = 0;
    *curPos++ = 0;
    *curPos++ = 0;
    *curPos++ = 1;
    return curPos;
}